

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globals.c
# Opt level: O1

void dumpDictKeys(object *dict)

{
  uint *puVar1;
  uint *puVar2;
  char *templ;
  int line_num;
  ulong uVar3;
  uint uVar4;
  
  if (dict == (object *)0x0) {
    templ = "Null dictionary oop passed!";
    line_num = 0x76;
  }
  else {
    puVar1 = (uint *)dict[1].header;
    if (puVar1 != (uint *)0x0) {
      if (3 < *puVar1) {
        uVar4 = *puVar1 >> 2;
        uVar3 = 0;
        do {
          puVar2 = *(uint **)(puVar1 + uVar3 * 2 + 4);
          if (puVar2 != (uint *)0x0) {
            printf("%.*s ",(ulong)(*puVar2 >> 2),puVar2 + 4);
          }
          uVar3 = uVar3 + 1;
        } while (uVar4 + (uVar4 == 0) != uVar3);
      }
      return;
    }
    templ = "Dictionary does not have any keys!";
    line_num = 0x7c;
  }
  info_impl("dumpDictKeys",line_num,templ);
  return;
}

Assistant:

void dumpDictKeys(struct object *dict)
{
    struct object *keys;
    struct object *key;
    int numKeys = 0;

    if(!dict) {
        info("Null dictionary oop passed!");
        return;
    }

    keys = dict->data[keysInDictionary];
    if(!keys) {
        info("Dictionary does not have any keys!");
        return;
    }

    numKeys = SIZE(keys);

    for(int i=0; i<numKeys; i++) {
        struct byteObject *key = (struct byteObject *)keys->data[i];

        if(key) {
            printf("%.*s ", SIZE(key), bytePtr(key));
        }
    }
}